

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O0

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>::addFineLevels
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_> *this,
          int num_new_fine_levels)

{
  Long LVar1;
  iterator __position;
  iterator this_00;
  uint uVar2;
  int in_ESI;
  uint uVar3;
  long in_RDI;
  __normal_iterator<amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
  __first;
  bool in_stack_00000022;
  bool in_stack_00000023;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  Geometry *in_stack_00000030;
  GeometryShop<amrex::EB2::PlaneIF,_int> *in_stack_00000038;
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_> *in_stack_00000040;
  int i;
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_> fine_isp;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd5c;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
  *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  int rr;
  Geometry *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd78;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
  *in_stack_fffffffffffffd80;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_fffffffffffffd90;
  __normal_iterator<amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
  __last;
  const_iterator in_stack_fffffffffffffda8;
  int local_198;
  
  rr = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  if (0 < in_ESI) {
    if (0 < *(int *)(in_RDI + 0x4c)) {
      *(int *)(in_RDI + 0x4c) = in_ESI + *(int *)(in_RDI + 0x4c);
    }
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    refine(in_stack_fffffffffffffd70,rr);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    uVar4 = *(undefined4 *)(in_RDI + 0x4c);
    uVar3 = *(byte *)(in_RDI + 0x49) & 1;
    uVar2 = *(byte *)(in_RDI + 0x48) & 1;
    IndexSpaceImp(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
                  in_stack_00000028,in_stack_00000024,in_stack_00000023,in_stack_00000022,
                  fine_isp.m_gshop.m_f.m_point.x._0_4_);
    Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x11b3755);
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
    ::reserve(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    for (local_198 = 0;
        LVar1 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                          ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x11b379e),
        local_198 < LVar1; local_198 = local_198 + 1) {
      Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
      ::operator[]((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd54,uVar3),
                   CONCAT44(in_stack_fffffffffffffd4c,uVar2));
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>>>
      ::emplace_back<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>>
                (in_stack_fffffffffffffd60,
                 (GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffd5c,uVar4));
    }
    std::
    swap<amrex::Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>>>>
              ((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
                *)in_stack_fffffffffffffd60,
               (Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd5c,uVar4));
    __first._M_current = (Geometry *)(in_RDI + 0x68);
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::begin
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    __gnu_cxx::
    __normal_iterator<amrex::Geometry_const*,std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>>
    ::__normal_iterator<amrex::Geometry*>
              ((__normal_iterator<const_amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
                *)CONCAT44(in_stack_fffffffffffffd54,uVar3),
               (__normal_iterator<amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
                *)CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    __last._M_current = (Geometry *)&stack0xffffffffffffffa8;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::begin
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::end
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    __position = std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
                 insert<__gnu_cxx::__normal_iterator<amrex::Geometry*,std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>>,void>
                           ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                            in_stack_fffffffffffffd90,in_stack_fffffffffffffda8,__first,__last);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    __gnu_cxx::
    __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
    __normal_iterator<amrex::Box*>
              ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)CONCAT44(in_stack_fffffffffffffd54,uVar3),
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    this_00 = std::vector<amrex::Box,std::allocator<amrex::Box>>::
              insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                        (in_stack_fffffffffffffd90,(const_iterator)__position._M_current,
                         (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                          )__first._M_current,
                         (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                          )__last._M_current);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd54,uVar3),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd4c,uVar2));
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,_std::allocator<int>_> *)this_00._M_current,
               (const_iterator)__position._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    ~IndexSpaceImp((IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd54,uVar3));
  }
  return;
}

Assistant:

void
IndexSpaceImp<G>::addFineLevels (int num_new_fine_levels)
{
    if (num_new_fine_levels <= 0) { return; }

    if (m_num_coarsen_opt > 0) {
        m_num_coarsen_opt += num_new_fine_levels;
    }

    IndexSpaceImp<G> fine_isp(m_gshop, amrex::refine(m_geom[0], 1<<num_new_fine_levels),
                              num_new_fine_levels-1, num_new_fine_levels-1,
                              m_ngrow[0], m_build_coarse_level_by_coarsening,
                              m_extend_domain_face, m_num_coarsen_opt);

    fine_isp.m_gslevel.reserve(m_domain.size()+num_new_fine_levels);
    for (int i = 0; i < m_domain.size(); ++i) {
        fine_isp.m_gslevel.emplace_back(std::move(m_gslevel[i]));
    }
    std::swap(fine_isp.m_gslevel, m_gslevel);

    m_geom.insert(m_geom.begin(), fine_isp.m_geom.begin(), fine_isp.m_geom.end());
    m_domain.insert(m_domain.begin(), fine_isp.m_domain.begin(), fine_isp.m_domain.end());
    m_ngrow.insert(m_ngrow.begin(), fine_isp.m_ngrow.begin(), fine_isp.m_ngrow.end());
}